

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

void secp256k1_nonce_function_musig
               (secp256k1_scalar *k,uchar *session_secrand,uchar *msg32,uchar *seckey32,uchar *pk33,
               uchar *agg_pk32,uchar *extra_input32)

{
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  secp256k1_sha256 sha_tmp;
  uchar buf [32];
  uchar msg_present;
  uchar i;
  uchar rand [32];
  secp256k1_sha256 sha;
  undefined7 in_stack_fffffffffffffea8;
  uchar in_stack_fffffffffffffeaf;
  int *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  secp256k1_sha256 *in_stack_fffffffffffffec0;
  byte local_b9;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 local_98 [120];
  long local_20;
  long local_18;
  
  local_18 = in_RDX;
  if (in_RCX == 0) {
    local_b8 = *in_RSI;
    local_b0 = in_RSI[1];
    local_a8 = in_RSI[2];
    local_a0 = in_RSI[3];
  }
  else {
    local_20 = in_RCX;
    secp256k1_nonce_function_musig_sha256_tagged_aux((secp256k1_sha256 *)0x1321bb);
    secp256k1_sha256_write
              (in_stack_fffffffffffffec0,
               (uchar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (size_t)in_stack_fffffffffffffeb0);
    secp256k1_sha256_finalize
              (in_stack_fffffffffffffec0,
               (uchar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    for (local_b9 = 0; local_b9 < 0x20; local_b9 = local_b9 + 1) {
      *(byte *)((long)&local_b8 + (ulong)local_b9) =
           *(byte *)((long)&local_b8 + (ulong)local_b9) ^ *(byte *)(local_20 + (ulong)local_b9);
    }
  }
  secp256k1_nonce_function_musig_sha256_tagged((secp256k1_sha256 *)0x132284);
  secp256k1_sha256_write
            (in_stack_fffffffffffffec0,
             (uchar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (size_t)in_stack_fffffffffffffeb0);
  secp256k1_nonce_function_musig_helper
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(uchar *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeaf);
  secp256k1_nonce_function_musig_helper
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(uchar *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeaf);
  secp256k1_sha256_write
            (in_stack_fffffffffffffec0,
             (uchar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (size_t)in_stack_fffffffffffffeb0);
  if (local_18 != 0) {
    secp256k1_nonce_function_musig_helper
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
               (uchar *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeaf);
  }
  secp256k1_nonce_function_musig_helper
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(uchar *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeaf);
  for (local_b9 = 0; local_b9 < 2; local_b9 = local_b9 + 1) {
    memcpy(&stack0xfffffffffffffeb0,local_98,0x68);
    secp256k1_sha256_write
              (in_stack_fffffffffffffec0,
               (uchar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (size_t)in_stack_fffffffffffffeb0);
    secp256k1_sha256_finalize
              (in_stack_fffffffffffffec0,
               (uchar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    secp256k1_scalar_set_b32
              ((secp256k1_scalar *)in_stack_fffffffffffffec0,
               (uchar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb0);
    secp256k1_memclear(in_stack_fffffffffffffeb0,
                       CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    secp256k1_sha256_clear((secp256k1_sha256 *)0x1323ea);
  }
  secp256k1_memclear(in_stack_fffffffffffffeb0,
                     CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  secp256k1_sha256_clear((secp256k1_sha256 *)0x13241e);
  return;
}

Assistant:

static void secp256k1_nonce_function_musig(secp256k1_scalar *k, const unsigned char *session_secrand, const unsigned char *msg32, const unsigned char *seckey32, const unsigned char *pk33, const unsigned char *agg_pk32, const unsigned char *extra_input32) {
    secp256k1_sha256 sha;
    unsigned char rand[32];
    unsigned char i;
    unsigned char msg_present;

    if (seckey32 != NULL) {
        secp256k1_nonce_function_musig_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, session_secrand, 32);
        secp256k1_sha256_finalize(&sha, rand);
        for (i = 0; i < 32; i++) {
            rand[i] ^= seckey32[i];
        }
    } else {
        memcpy(rand, session_secrand, sizeof(rand));
    }

    secp256k1_nonce_function_musig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, rand, sizeof(rand));
    secp256k1_nonce_function_musig_helper(&sha, 1, pk33, 33);
    secp256k1_nonce_function_musig_helper(&sha, 1, agg_pk32, 32);
    msg_present = msg32 != NULL;
    secp256k1_sha256_write(&sha, &msg_present, 1);
    if (msg_present) {
        secp256k1_nonce_function_musig_helper(&sha, 8, msg32, 32);
    }
    secp256k1_nonce_function_musig_helper(&sha, 4, extra_input32, 32);

    for (i = 0; i < 2; i++) {
        unsigned char buf[32];
        secp256k1_sha256 sha_tmp = sha;
        secp256k1_sha256_write(&sha_tmp, &i, 1);
        secp256k1_sha256_finalize(&sha_tmp, buf);
        secp256k1_scalar_set_b32(&k[i], buf, NULL);

        /* Attempt to erase secret data */
        secp256k1_memclear(buf, sizeof(buf));
        secp256k1_sha256_clear(&sha_tmp);
    }
    secp256k1_memclear(rand, sizeof(rand));
    secp256k1_sha256_clear(&sha);
}